

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall DomResourceIcon::~DomResourceIcon(DomResourceIcon *this)

{
  DomResourcePixmap *pDVar1;
  
  pDVar1 = this->m_normalOff;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
  }
  operator_delete(pDVar1,0x58);
  pDVar1 = this->m_normalOn;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
  }
  operator_delete(pDVar1,0x58);
  pDVar1 = this->m_disabledOff;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
  }
  operator_delete(pDVar1,0x58);
  pDVar1 = this->m_disabledOn;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
  }
  operator_delete(pDVar1,0x58);
  pDVar1 = this->m_activeOff;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
  }
  operator_delete(pDVar1,0x58);
  pDVar1 = this->m_activeOn;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
  }
  operator_delete(pDVar1,0x58);
  pDVar1 = this->m_selectedOff;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
  }
  operator_delete(pDVar1,0x58);
  pDVar1 = this->m_selectedOn;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
  }
  operator_delete(pDVar1,0x58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_resource).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_theme).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

DomResourceIcon::~DomResourceIcon()
{
    delete m_normalOff;
    delete m_normalOn;
    delete m_disabledOff;
    delete m_disabledOn;
    delete m_activeOff;
    delete m_activeOn;
    delete m_selectedOff;
    delete m_selectedOn;
}